

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

floatx80 floatx80_move_m68k(floatx80 a,float_status *status)

{
  unkuint10 Var1;
  flag zSign;
  int32_t zExp;
  uint64_t zSig0;
  uint16_t uVar2;
  undefined8 extraout_RDX;
  floatx80 fVar3;
  floatx80 fVar4;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  uint64_t aSig;
  int32_t aExp;
  flag aSign;
  float_status *status_local;
  floatx80 a_local;
  
  uVar2 = a.high;
  Var1 = a._0_10_;
  a_00._10_6_ = 0;
  a_00.low = (long)Var1;
  a_00.high = (short)(Var1 >> 0x40);
  zSig0 = extractFloatx80Frac(a_00);
  a_01._10_6_ = 0;
  a_01.low = (long)Var1;
  a_01.high = (short)(Var1 >> 0x40);
  zExp = extractFloatx80Exp(a_01);
  a_02._10_6_ = 0;
  a_02.low = (long)Var1;
  a_02.high = (short)(Var1 >> 0x40);
  zSign = extractFloatx80Sign(a_02);
  if (zExp == 0x7fff) {
    if ((zSig0 & 0x7fffffffffffffff) == 0) {
      fVar3._8_8_ = extraout_RDX;
      fVar3.low = a.low;
    }
    else {
      a_03._10_6_ = 0;
      a_03.low = (long)Var1;
      a_03.high = (short)(Var1 >> 0x40);
      fVar3 = propagateFloatx80NaNOneArg(a_03,status);
      uVar2 = fVar3.high;
    }
  }
  else {
    if (zExp == 0) {
      if (zSig0 == 0) {
        fVar3._8_8_ = extraout_RDX;
        fVar3.low = a.low;
        goto LAB_008b0a6b;
      }
      normalizeRoundAndPackFloatx80_m68k(status->floatx80_rounding_precision,zSign,0,zSig0,0,status)
      ;
    }
    fVar3 = roundAndPackFloatx80_m68k(status->floatx80_rounding_precision,zSign,zExp,zSig0,0,status)
    ;
    uVar2 = fVar3.high;
  }
LAB_008b0a6b:
  a_local._8_8_ = fVar3.low;
  fVar4._10_6_ = fVar3._10_6_;
  fVar4.high = uVar2;
  fVar4.low = a_local._8_8_;
  return fVar4;
}

Assistant:

floatx80 floatx80_move(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig;

    aSig = extractFloatx80Frac(a);
    aExp = extractFloatx80Exp(a);
    aSign = extractFloatx80Sign(a);

    if (aExp == 0x7FFF) {
        if ((uint64_t)(aSig << 1)) {
            return propagateFloatx80NaNOneArg(a, status);
        }
        return a;
    }
    if (aExp == 0) {
        if (aSig == 0) {
            return a;
        }
        normalizeRoundAndPackFloatx80(status->floatx80_rounding_precision,
                                      aSign, aExp, aSig, 0, status);
    }
    return roundAndPackFloatx80(status->floatx80_rounding_precision, aSign,
                                aExp, aSig, 0, status);
}